

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O2

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_38d868::ExternalFixupMembersImport::parse
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,string *src,
          database *db,string_mapping *names)

{
  external_fixup_collection fixups;
  _Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> local_48
  ;
  not_null<external_fixup_collection_*> local_30;
  
  local_30.ptr_ =
       (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *)
       &local_48;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pstore::gsl::
  not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
  ::ensure_invariant(&local_30);
  parse(__return_storage_ptr__,src,db,names,local_30);
  std::_Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
  ~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static decltype (auto) parse (std::string const & src, pstore::database * const db,
                                      pstore::exchange::import_ns::string_mapping const & names) {
            external_fixup_collection fixups;
            return parse (src, db, names, &fixups);
        }